

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O3

saidx64_t sa_simplesearch64(sauchar_t *T,saidx64_t Tsize,saidx64_t *SA,saidx64_t SAsize,saint_t c,
                           saidx64_t *idx)

{
  saidx64_t sVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  
  if (idx != (saidx64_t *)0x0) {
    *idx = -1;
  }
  sVar1 = -1;
  if (-1 < (SAsize | Tsize) && (SA != (saidx64_t *)0x0 && T != (sauchar_t *)0x0)) {
    if (SAsize != 0 && Tsize != 0) {
      if (SAsize < 1) {
        lVar2 = 0;
      }
      else {
        lVar2 = 0;
        do {
          uVar7 = (ulong)SAsize >> 1;
          lVar3 = lVar2 + uVar7;
          if ((SA[lVar3] < Tsize) && (c <= (int)(uint)T[SA[lVar3]])) {
            if ((uint)T[SA[lVar3]] == c) {
              uVar5 = ~uVar7;
              lVar6 = lVar2;
              if (1 < (ulong)SAsize) {
                do {
                  uVar4 = uVar7 >> 1;
                  if ((Tsize <= SA[lVar6 + uVar4]) || ((int)(uint)T[SA[lVar6 + uVar4]] < c)) {
                    lVar6 = lVar6 + uVar4 + 1;
                    uVar4 = uVar4 - (~(uint)uVar7 & 1);
                  }
                  uVar7 = uVar4;
                } while (0 < (long)uVar4);
              }
              lVar3 = lVar3 + 1;
              uVar7 = uVar5 + SAsize;
              while (uVar5 = uVar7, 0 < (long)uVar5) {
                uVar7 = uVar5 >> 1;
                if ((Tsize <= SA[lVar3 + uVar7]) || ((int)(uint)T[SA[lVar3 + uVar7]] <= c)) {
                  lVar3 = lVar3 + uVar7 + 1;
                  uVar7 = uVar7 - (~(uint)uVar5 & 1);
                }
              }
              goto LAB_00106dc9;
            }
          }
          else {
            lVar2 = lVar3 + 1;
            uVar7 = uVar7 - (~(uint)SAsize & 1);
          }
          SAsize = uVar7;
        } while (0 < (long)uVar7);
      }
      lVar6 = 0;
      lVar3 = 0;
LAB_00106dc9:
      if (idx != (saidx64_t *)0x0) {
        if (lVar6 < lVar3) {
          lVar2 = lVar6;
        }
        *idx = lVar2;
      }
      return lVar3 - lVar6;
    }
    sVar1 = 0;
  }
  return sVar1;
}

Assistant:

saidx_t
sa_simplesearch(const sauchar_t *T, saidx_t Tsize,
                const saidx_t *SA, saidx_t SAsize,
                saint_t c, saidx_t *idx) {
  saidx_t size, lsize, rsize, half;
  saidx_t i, j, k, p;
  saint_t r;

  if(idx != NULL) { *idx = -1; }
  if((T == NULL) || (SA == NULL) || (Tsize < 0) || (SAsize < 0)) { return -1; }
  if((Tsize == 0) || (SAsize == 0)) { return 0; }

  for(i = j = k = 0, size = SAsize, half = size >> 1;
      0 < size;
      size = half, half >>= 1) {
    p = SA[i + half];
    r = (p < Tsize) ? T[p] - c : -1;
    if(r < 0) {
      i += half + 1;
      half -= (size & 1) ^ 1;
    } else if(r == 0) {
      lsize = half, j = i, rsize = size - half - 1, k = i + half + 1;

      /* left part */
      for(half = lsize >> 1;
          0 < lsize;
          lsize = half, half >>= 1) {
        p = SA[j + half];
        r = (p < Tsize) ? T[p] - c : -1;
        if(r < 0) {
          j += half + 1;
          half -= (lsize & 1) ^ 1;
        }
      }

      /* right part */
      for(half = rsize >> 1;
          0 < rsize;
          rsize = half, half >>= 1) {
        p = SA[k + half];
        r = (p < Tsize) ? T[p] - c : -1;
        if(r <= 0) {
          k += half + 1;
          half -= (rsize & 1) ^ 1;
        }
      }

      break;
    }
  }

  if(idx != NULL) { *idx = (0 < (k - j)) ? j : i; }
  return k - j;
}